

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O2

void __thiscall
enact::VariableStmt::VariableStmt
          (VariableStmt *this,Token *keyword,Token *name,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typeName,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *initializer)

{
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__VariableStmt_00124130;
  Token::Token(&this->keyword,keyword);
  Token::Token(&this->name,name);
  (this->typeName)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (typeName->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (typeName->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  (this->initializer)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (initializer->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (initializer->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  return;
}

Assistant:

VariableStmt(
                Token keyword,
                Token name,
                std::unique_ptr<const Typename> typeName,
                std::unique_ptr<Expr> initializer) :
                keyword{std::move(keyword)},
                name{std::move(name)},
                typeName{std::move(typeName)},
                initializer{std::move(initializer)} {}